

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
::disposeImpl(DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
              *this,void *pointer)

{
  Own<kj::(anonymous_namespace)::NullInputStream>::~Own
            (&(this->
              super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
              ).first);
  OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>::~OwnedBundle
            (&(this->
              super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::NullInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
              ).super_OwnedBundle<kj::String,_kj::Own<kj::HttpHeaders>_>);
  operator_delete(this,0x40);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }